

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_members_pass.cpp
# Opt level: O2

void __thiscall
spvtools::opt::EliminateDeadMembersPass::MarkMembersAsLiveForExtract
          (EliminateDeadMembersPass *this,Instruction *inst)

{
  Op OVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  undefined8 in_RAX;
  DefUseManager *pDVar4;
  Instruction *pIVar5;
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  *this_00;
  uint32_t uVar6;
  uint32_t member_idx;
  uint32_t local_38;
  uint local_34;
  
  local_34 = (uint)((ulong)in_RAX >> 0x20);
  if (inst->opcode_ == OpCompositeExtract) {
    uVar2 = 0;
LAB_004b546c:
    uVar3 = Instruction::GetSingleWordInOperand(inst,uVar2);
    pDVar4 = Pass::get_def_use_mgr((Pass *)this);
    pIVar5 = analysis::DefUseManager::GetDef(pDVar4,uVar3);
    uVar3 = Instruction::type_id(pIVar5);
    _local_38 = CONCAT44(local_34,uVar3);
    do {
      uVar2 = uVar2 + 1;
      uVar3 = Instruction::NumInOperands(inst);
      if (uVar3 <= uVar2) {
        return;
      }
      pDVar4 = Pass::get_def_use_mgr((Pass *)this);
      pIVar5 = analysis::DefUseManager::GetDef(pDVar4,local_38);
      uVar3 = Instruction::GetSingleWordInOperand(inst,uVar2);
      OVar1 = pIVar5->opcode_;
      uVar6 = 0;
      local_34 = uVar3;
      if (OVar1 < OpTypeOpaque) {
        uVar3 = 0;
        if ((0x31800000U >> (OVar1 & OpTypeOpaque) & 1) == 0) {
          if (OVar1 != OpTypeStruct) goto LAB_004b5522;
          this_00 = (_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                     *)std::__detail::
                       _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)&this->used_members_,&local_38);
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_insert_unique<unsigned_int_const&>(this_00,&local_34);
          uVar3 = local_34;
        }
      }
      else {
LAB_004b5522:
        uVar3 = uVar6;
        if (((OVar1 != OpTypeCooperativeMatrixKHR) && (OVar1 != OpTypeCooperativeVectorNV)) &&
           (OVar1 != OpTypeCooperativeMatrixNV)) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                        ,0xd6,
                        "void spvtools::opt::EliminateDeadMembersPass::MarkMembersAsLiveForExtract(const Instruction *)"
                       );
        }
      }
      uVar3 = Instruction::GetSingleWordInOperand(pIVar5,uVar3);
      _local_38 = CONCAT44(local_34,uVar3);
    } while( true );
  }
  if (inst->opcode_ == OpSpecConstantOp) {
    uVar2 = Instruction::GetSingleWordInOperand(inst,0);
    if (uVar2 == 0x51) {
      uVar2 = (uint32_t)(inst->opcode_ == OpSpecConstantOp);
      goto LAB_004b546c;
    }
  }
  __assert_fail("inst->opcode() == spv::Op::OpCompositeExtract || (inst->opcode() == spv::Op::OpSpecConstantOp && spv::Op(inst->GetSingleWordInOperand(kSpecConstOpOpcodeIdx)) == spv::Op::OpCompositeExtract)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                ,0xbc,
                "void spvtools::opt::EliminateDeadMembersPass::MarkMembersAsLiveForExtract(const Instruction *)"
               );
}

Assistant:

void EliminateDeadMembersPass::MarkMembersAsLiveForExtract(
    const Instruction* inst) {
  assert(inst->opcode() == spv::Op::OpCompositeExtract ||
         (inst->opcode() == spv::Op::OpSpecConstantOp &&
          spv::Op(inst->GetSingleWordInOperand(kSpecConstOpOpcodeIdx)) ==
              spv::Op::OpCompositeExtract));

  uint32_t first_operand =
      (inst->opcode() == spv::Op::OpSpecConstantOp ? 1 : 0);
  uint32_t composite_id = inst->GetSingleWordInOperand(first_operand);
  Instruction* composite_inst = get_def_use_mgr()->GetDef(composite_id);
  uint32_t type_id = composite_inst->type_id();

  for (uint32_t i = first_operand + 1; i < inst->NumInOperands(); ++i) {
    Instruction* type_inst = get_def_use_mgr()->GetDef(type_id);
    uint32_t member_idx = inst->GetSingleWordInOperand(i);
    switch (type_inst->opcode()) {
      case spv::Op::OpTypeStruct:
        used_members_[type_id].insert(member_idx);
        type_id = type_inst->GetSingleWordInOperand(member_idx);
        break;
      case spv::Op::OpTypeArray:
      case spv::Op::OpTypeRuntimeArray:
      case spv::Op::OpTypeVector:
      case spv::Op::OpTypeMatrix:
      case spv::Op::OpTypeCooperativeMatrixNV:
      case spv::Op::OpTypeCooperativeMatrixKHR:
      case spv::Op::OpTypeCooperativeVectorNV:
        type_id = type_inst->GetSingleWordInOperand(0);
        break;
      default:
        assert(false);
    }
  }
}